

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O1

bool density_tests::detail::
     ReentrantPush<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
     ::put(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
           *queue,EasyRandom *i_rand)

{
  result_type_conflict rVar1;
  uint32_t val;
  uint local_14;
  param_type local_10;
  
  local_14 = 0x20;
  local_10._M_a = 0;
  local_10._M_b = 1;
  rVar1 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_10,&i_rand->m_rand,&local_10);
  if (rVar1 == 0) {
    density::
    lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>
    ::emplace<unsigned_int,unsigned_int&>
              ((lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>
                *)queue,&local_14);
  }
  else {
    density::
    lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>
    ::reentrant_emplace<unsigned_int,unsigned_int&>
              ((lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)1>
                *)queue,&local_14);
  }
  return true;
}

Assistant:

static bool put(QUEUE & queue, EasyRandom & i_rand)
            {
                uint32_t val = 32;
                if (i_rand.get_bool())
                    queue.push(val);
                else
                    queue.reentrant_push(val);
                return true;
            }